

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O2

ON_FontFaceQuartet * __thiscall
ON_FontList::QuartetFromQuartetName
          (ON_FontFaceQuartet *__return_storage_ptr__,ON_FontList *this,wchar_t *quartet_name)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  ON_ClassArray<ON_FontFaceQuartet> *this_00;
  wchar_t *pwVar6;
  wchar_t *string2;
  uint uVar7;
  char cVar8;
  uint uVar9;
  long lVar10;
  ON_wString locName;
  ON_wString local_90;
  ON_wString local_88;
  undefined1 local_80 [40];
  ON_FontFaceQuartet qname;
  
  ON_FontFaceQuartet::ON_FontFaceQuartet
            (&qname,quartet_name,(ON_Font *)0x0,(ON_Font *)0x0,(ON_Font *)0x0,(ON_Font *)0x0);
  ON_wString::ON_wString((ON_wString *)local_80,&qname.m_quartet_name);
  bVar2 = ON_wString::IsEmpty((ON_wString *)local_80);
  ON_wString::~ON_wString((ON_wString *)local_80);
  if (bVar2) {
    cVar8 = '\x02';
  }
  else {
    this_00 = QuartetList(this);
    iVar5 = this_00->m_count;
    uVar3 = ON_ClassArray<ON_FontFaceQuartet>::BinarySearch
                      (this_00,&qname,ON_FontFaceQuartet::CompareQuartetName);
    if ((int)uVar3 < 0 || iVar5 <= (int)uVar3) {
      ON_wString::ON_wString(&local_90,quartet_name);
      ON_ManagedFonts::InstalledFonts();
      iVar4 = ON_ManagedFonts::List.m_installed_fonts.m_by_index.m_count;
      local_88.m_s = (wchar_t *)__return_storage_ptr__;
      for (lVar10 = 0; lVar10 < iVar4; lVar10 = lVar10 + 1) {
        if (ON_ManagedFonts::List.m_installed_fonts.m_by_index.m_a[lVar10] != (ON_Font *)0x0) {
          ON_Font::WindowsLogfontName
                    ((ON_Font *)local_80,
                     (NameLocale)ON_ManagedFonts::List.m_installed_fonts.m_by_index.m_a[lVar10]);
          pwVar6 = ON_wString::operator_cast_to_wchar_t_(&local_90);
          string2 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)local_80);
          iVar4 = ON_wString::CompareOrdinal(pwVar6,string2,true);
          if (iVar4 == 0) {
            ON_Font::QuartetName((ON_Font *)&locName);
            ON_wString::~ON_wString((ON_wString *)local_80);
            goto LAB_0049af12;
          }
          ON_wString::~ON_wString((ON_wString *)local_80);
          iVar4 = ON_ManagedFonts::List.m_installed_fonts.m_by_index.m_count;
        }
      }
      ON_wString::ON_wString(&locName,&ON_wString::EmptyString);
LAB_0049af12:
      __return_storage_ptr__ = (ON_FontFaceQuartet *)local_88.m_s;
      cVar8 = '\x02';
      ON_wString::~ON_wString(&local_90);
      bVar2 = ON_wString::IsEmpty(&locName);
      if (bVar2) {
        bVar2 = false;
      }
      else {
        pwVar6 = ON_wString::operator_cast_to_wchar_t_(&locName);
        ON_FontFaceQuartet::ON_FontFaceQuartet
                  ((ON_FontFaceQuartet *)local_80,pwVar6,(ON_Font *)0x0,(ON_Font *)0x0,
                   (ON_Font *)0x0,(ON_Font *)0x0);
        ON_FontFaceQuartet::operator=(&qname,(ON_FontFaceQuartet *)local_80);
        ON_wString::~ON_wString((ON_wString *)local_80);
        uVar3 = ON_ClassArray<ON_FontFaceQuartet>::BinarySearch
                          (this_00,&qname,ON_FontFaceQuartet::CompareQuartetName);
        bVar2 = (int)uVar3 < iVar5 && -1 < (int)uVar3;
        cVar8 = ((int)uVar3 >= iVar5 || -1 >= (int)uVar3) * '\x02';
      }
      ON_wString::~ON_wString(&locName);
      if (!bVar2) goto LAB_0049affb;
    }
    uVar1 = uVar3;
    lVar10 = (ulong)uVar3 * 0x28;
    do {
      uVar7 = uVar1;
      uVar9 = (int)uVar3 >> 0x1f & uVar3;
      if ((int)uVar7 < 1) break;
      iVar5 = ON_FontFaceQuartet::CompareQuartetName
                        (&qname,(ON_FontFaceQuartet *)
                                ((long)&this_00->m_a[-1].m_quartet_name.m_s + lVar10));
      uVar1 = uVar7 - 1;
      uVar9 = uVar7;
      lVar10 = lVar10 + -0x28;
    } while (iVar5 == 0);
    ON_FontFaceQuartet::ON_FontFaceQuartet(__return_storage_ptr__,this_00->m_a + (int)uVar9);
    cVar8 = '\x01';
  }
LAB_0049affb:
  ON_wString::~ON_wString(&qname.m_quartet_name);
  if (cVar8 == '\x02') {
    ON_FontFaceQuartet::ON_FontFaceQuartet(__return_storage_ptr__,&ON_FontFaceQuartet::Empty);
  }
  return __return_storage_ptr__;
}

Assistant:

const ON_FontFaceQuartet ON_FontList::QuartetFromQuartetName(
  const wchar_t* quartet_name
) const
{
  for (;;)
  {
    ON_FontFaceQuartet qname(quartet_name, nullptr, nullptr, nullptr, nullptr);
    if (qname.QuartetName().IsEmpty())
      break;

    const ON_ClassArray<ON_FontFaceQuartet>& quartet_list = ON_FontList::QuartetList();
    const int quartet_list_count = quartet_list.Count();
    int i = quartet_list.BinarySearch(&qname, ON_FontFaceQuartet::CompareQuartetName);

    bool failedOnFirstTry = i < 0 || i >= quartet_list_count;
    if (failedOnFirstTry)
    {
      //  ... then find the localized name and try again.
      // The QuartetNames in the QuartetList above are localized but sometimes the quartet_name passed to
      // this function is in english. In many cases the localized name and the english name are the same
      // so there is no problem. It is a problem for Japanese and Chinese languages for example. RH-64285
      ON_wString locName = ON_FontList__EnNameToLocName(quartet_name);
      if (locName.IsEmpty())
      {
        break;
      }
      qname = ON_FontFaceQuartet(locName, nullptr, nullptr, nullptr, nullptr);
      i = quartet_list.BinarySearch(&qname, ON_FontFaceQuartet::CompareQuartetName);
      if (i < 0 || i >= quartet_list_count)
      {
        break;
      }
    }

    while (i > 0 && 0 == ON_FontFaceQuartet::CompareQuartetName(&qname, &quartet_list[i - 1]))
      i--;
    return quartet_list[i];
  }
  return ON_FontFaceQuartet::Empty;
}